

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O2

void no_epollin_on_closed_empty_pipe_impl(_Bool do_write_data)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  uint8_t data;
  int fds [3];
  epoll_event event_result;
  epoll_event event;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    pcVar4 = "ep >= 0";
    uVar5 = 0x2c4;
  }
  else {
    fd_pipe(fds);
    event.events = 0x2001;
    event.data.fd = fds[0];
    iVar2 = epoll_ctl(iVar1,1,fds[0],(epoll_event *)&event);
    if (iVar2 == 0) {
      data = '\0';
      if (do_write_data) {
        write(fds[1],&data,1);
      }
      close(fds[1]);
      iVar2 = epoll_wait(iVar1,(epoll_event *)&event_result,1,-1);
      if (iVar2 == 1) {
        if (event_result.events != (do_write_data | 0x10)) {
          microatf_fail_require
                    ("%s:%d: %x",
                     "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                     ,0x2da);
        }
        sVar3 = read(fds[0],&data,1);
        if (sVar3 < 0) {
          pcVar4 = "read(fds[0], &data, 1) >= 0";
          uVar5 = 0x2dc;
        }
        else if (event_result.data.fd == fds[0]) {
          iVar2 = close(event_result.data.fd);
          if (iVar2 == 0) {
            iVar1 = close(iVar1);
            if (iVar1 == 0) {
              return;
            }
            pcVar4 = "close(ep) == 0";
            uVar5 = 0x2e1;
          }
          else {
            pcVar4 = "close(fds[0]) == 0";
            uVar5 = 0x2e0;
          }
        }
        else {
          pcVar4 = "event_result.data.fd == fds[0]";
          uVar5 = 0x2de;
        }
      }
      else {
        pcVar4 = "epoll_wait(ep, &event_result, 1, -1) == 1";
        uVar5 = 0x2d6;
      }
    }
    else {
      pcVar4 = "epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0";
      uVar5 = 0x2cd;
    }
  }
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar5,pcVar4);
}

Assistant:

static void
no_epollin_on_closed_empty_pipe_impl(bool do_write_data)
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_pipe(fds);

	struct epoll_event event;
	event.events = EPOLLIN | EPOLLRDHUP;
	event.data.fd = fds[0];

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0);

	uint8_t data = '\0';
	if (do_write_data) {
		write(fds[1], &data, 1);
	}
	close(fds[1]);

	struct epoll_event event_result;
	ATF_REQUIRE(epoll_wait(ep, &event_result, 1, -1) == 1);

	ATF_REQUIRE_MSG(event_result.events ==
		(EPOLLHUP | (do_write_data ? EPOLLIN : 0)),
	    "%x", event_result.events);

	ATF_REQUIRE(read(fds[0], &data, 1) >= 0);

	ATF_REQUIRE(event_result.data.fd == fds[0]);

	ATF_REQUIRE(close(fds[0]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}